

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,longdouble kappa,longdouble delta,longdouble theta,longdouble obj_amp)

{
  int k;
  rc_data *begin;
  long lVar1;
  bool bVar2;
  uint r_size;
  int iVar3;
  bool bVar4;
  long lVar5;
  int bk_max;
  long lVar6;
  undefined1 local_a0 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_90;
  solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>
  *local_88;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_80;
  longdouble local_74;
  solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>
  *local_68;
  pair<int,_int> *local_60;
  longdouble local_54;
  longdouble local_48;
  longdouble local_3c;
  
  local_68 = this + 0x10;
  bVar4 = false;
  local_3c = theta;
  local_48 = delta;
  local_54 = kappa;
  local_88 = this + 0x100;
  local_90._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (tuple<int_*,_std::default_delete<int[]>_>)((long)this + 0x80);
  local_74 = obj_amp;
  local_80._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
       (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
        )(tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )x;
  local_60 = last._M_current;
  do {
    if (first._M_current == local_60) {
      return bVar4;
    }
    k = (first._M_current)->first;
    lVar6 = (long)k;
    sparse_matrix<int>::row((sparse_matrix<int> *)local_a0,(int)local_68);
    solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
    ::decrease_preference
              ((solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                *)this,(row_iterator)local_a0._8_8_,(row_iterator)local_a0._0_8_,local_3c);
    r_size = solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
             ::compute_reduced_costs<baryonyx::bit_array>
                       ((solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                         *)this,(row_iterator)local_a0._8_8_,(row_iterator)local_a0._0_8_,
                        (bit_array *)
                        local_80._M_t.
                        super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                        .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                        _M_head_impl);
    begin = *(rc_data **)(this + 0x60);
    lVar1 = *(long *)(this + 0x178);
    for (lVar5 = 0; (ulong)r_size << 5 != lVar5; lVar5 = lVar5 + 0x20) {
      *(longdouble *)((long)&begin->value + lVar5) =
           *(longdouble *)((long)&begin->value + lVar5) +
           *(longdouble *)
            (*(long *)(lVar1 + 8) +
            (long)((row_iterator)(local_a0._8_8_ + (long)*(int *)((long)&begin->id + lVar5) * 8))->
                  column * 0x10) * local_74;
    }
    switch(*(undefined1 *)(*(long *)(this + 0x68) + lVar6)) {
    case 0:
      calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*>
                (begin,begin + (int)r_size,*(random_engine **)(this + 8));
      iVar3 = *(int *)(*(long *)(this + 0x70) + lVar6 * 0xc);
      bk_max = *(int *)(*(long *)(this + 0x70) + 4 + lVar6 * 0xc);
LAB_0053338f:
      iVar3 = branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::
              solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data[]>>>
                        ((branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double> *)
                         local_90._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                         super__Head_base<0UL,_int_*,_false>._M_head_impl,
                         (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
                          *)(this + 0x60),r_size,iVar3,bk_max);
      break;
    case 1:
switchD_00533325_caseD_1:
      iVar3 = exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::
              solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data[]>>>
                        ((exhaustive_solver<baryonyx::itm::minimize_tag,long_double> *)local_88,k,
                         (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
                          *)(this + 0x60),r_size);
      break;
    case 2:
      calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*>
                (begin,begin + (int)r_size,*(random_engine **)(this + 8));
      lVar6 = lVar6 * 0xc;
      iVar3 = solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
              ::select_variables((solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                                  *)this,r_size,*(int *)(*(long *)(this + 0x70) + lVar6),
                                 *(int *)(*(long *)(this + 0x70) + 4 + lVar6));
      if (iVar3 == -2) {
        iVar3 = *(int *)(*(long *)(this + 0x70) + lVar6);
        bk_max = *(int *)(*(long *)(this + 0x70) + 4 + lVar6);
        goto LAB_0053338f;
      }
      break;
    case 3:
      calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*>
                (begin,begin + (int)r_size,*(random_engine **)(this + 8));
      iVar3 = solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
              ::select_variables((solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                                  *)this,r_size,*(int *)(*(long *)(this + 0x70) + lVar6 * 0xc),
                                 *(int *)(*(long *)(this + 0x70) + 4 + lVar6 * 0xc));
      if (iVar3 == -2) goto switchD_00533325_caseD_1;
      break;
    default:
      calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>::rc_data*>
                (begin,begin + (int)r_size,*(random_engine **)(this + 8));
      iVar3 = solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
              ::select_variables_101
                        ((solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                          *)this,r_size,*(int *)(*(long *)(this + 0x70) + lVar6 * 0xc),
                         *(int *)(*(long *)(this + 0x70) + 4 + lVar6 * 0xc));
    }
    bVar2 = local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
                      (this,(bit_array *)
                            local_80._M_t.
                            super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                            .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                            ._M_head_impl,(row_value *)local_a0._8_8_,k,iVar3,r_size,local_54,
                       local_48);
    bVar4 = (bool)(bVar4 | bVar2);
    first._M_current = first._M_current + 1;
  } while( true );
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            Float pi_change;
            int selected;

            switch (Z[k]) {
            case subsolver_type::branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::exhaustive:
                selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::unconstrained_branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::unconstrained_exhaustive:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::linear:
            default:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables_101(r_size, b[k].min, b[k].max);
                break;
            }

            pi_change = local_affect(
              x, std::get<0>(it), k, selected, r_size, kappa, delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }